

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolveAnalysis.cpp
# Opt level: O3

void __thiscall
HPresolveAnalysis::setup
          (HPresolveAnalysis *this,HighsLp *model_,HighsOptions *options_,HighsInt *numDeletedRows_,
          HighsInt *numDeletedCols_)

{
  uint uVar1;
  HighsOptions *pHVar2;
  ulong *puVar3;
  HighsInt HVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  string local_60;
  HighsLp *local_40;
  HighsOptions *local_38;
  
  this->model = model_;
  this->options = options_;
  this->numDeletedRows = numDeletedRows_;
  this->numDeletedCols = numDeletedCols_;
  uVar7 = 1;
  local_40 = model_;
  local_38 = options_;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&this->allow_rule_,0xe,true);
  if ((this->options->super_HighsOptionsStruct).presolve_rule_off != 0) {
    highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                 "Presolve rules not allowed:\n");
    uVar8 = 0;
    do {
      pHVar2 = this->options;
      uVar1 = (pHVar2->super_HighsOptionsStruct).presolve_rule_off;
      if (uVar8 < 6) {
        if ((uVar1 & uVar7) != 0) {
          utilPresolveRuleTypeToString_abi_cxx11_(&local_60,(HighsInt)uVar8);
          highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kWarning,
                       "Cannot disallow rule %2d (bit %4d): %s\n",uVar8 & 0xffffffff,(ulong)uVar7,
                       local_60._M_dataplus._M_p);
          goto LAB_003290e6;
        }
      }
      else {
        uVar6 = 1L << ((byte)uVar8 & 0x3f);
        puVar3 = (this->allow_rule_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        if ((uVar1 & uVar7) == 0) {
          *puVar3 = *puVar3 | uVar6;
        }
        else {
          *puVar3 = *puVar3 & ~uVar6;
          utilPresolveRuleTypeToString_abi_cxx11_(&local_60,(HighsInt)uVar8);
          highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
                       "   Rule %2d (bit %4d): %s\n",uVar8 & 0xffffffff,(ulong)uVar7,
                       local_60._M_dataplus._M_p);
LAB_003290e6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
        }
      }
      uVar7 = uVar7 * 2;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0xe);
  }
  if ((local_38->super_HighsOptionsStruct).presolve_rule_logging == true) {
    bVar5 = HighsLp::isMip(local_40);
    bVar5 = !bVar5;
  }
  else {
    bVar5 = false;
  }
  this->allow_logging_ = bVar5;
  this->logging_on_ = bVar5;
  this->log_rule_type_ = -1;
  this->num_deleted_rows0_ = 0;
  this->num_deleted_cols0_ = 0;
  std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::resize
            (&(this->presolve_log_).rule,0xe);
  memset((this->presolve_log_).rule.
         super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
         super__Vector_impl_data._M_start,0,0xa8);
  HVar4 = this->model->num_row_;
  this->original_num_col_ = this->model->num_col_;
  this->original_num_row_ = HVar4;
  return;
}

Assistant:

void HPresolveAnalysis::setup(const HighsLp* model_,
                              const HighsOptions* options_,
                              const HighsInt& numDeletedRows_,
                              const HighsInt& numDeletedCols_) {
  model = model_;
  options = options_;
  numDeletedRows = &numDeletedRows_;
  numDeletedCols = &numDeletedCols_;

  this->allow_rule_.assign(kPresolveRuleCount, true);

  if (options->presolve_rule_off) {
    // Some presolve rules are off
    //
    // Transform options->presolve_rule_off into logical settings in
    // allow_rule_[*], commenting on the rules switched off
    highsLogUser(options->log_options, HighsLogType::kInfo,
                 "Presolve rules not allowed:\n");
    HighsInt bit = 1;
    for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
         rule_type++) {
      // Identify whether this rule is allowed
      const bool allow = !(options->presolve_rule_off & bit);
      if (rule_type >= kPresolveRuleFirstAllowOff) {
        // This is a rule that can be switched off, so comment
        // positively if it is off
        allow_rule_[rule_type] = allow;
        if (!allow)
          highsLogUser(options->log_options, HighsLogType::kInfo,
                       "   Rule %2d (bit %4d): %s\n", (int)rule_type, (int)bit,
                       utilPresolveRuleTypeToString(rule_type).c_str());
      } else if (!allow) {
        // This is a rule that cannot be switched off so, if an
        // attempt is made, don't allow it to be off and comment
        // negatively
        highsLogUser(options->log_options, HighsLogType::kWarning,
                     "Cannot disallow rule %2d (bit %4d): %s\n", (int)rule_type,
                     (int)bit, utilPresolveRuleTypeToString(rule_type).c_str());
      }
      bit *= 2;
    }
  }
  // Allow logging if option is set and model is not a MIP
  allow_logging_ = options_->presolve_rule_logging && !model_->isMip();
  logging_on_ = allow_logging_;
  log_rule_type_ = kPresolveRuleIllegal;
  resetNumDeleted();
  presolve_log_.clear();
  original_num_col_ = model->num_col_;
  original_num_row_ = model->num_row_;
}